

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O0

int messagereceiver_open
              (MESSAGE_RECEIVER_HANDLE message_receiver,ON_MESSAGE_RECEIVED on_message_received,
              void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  void *callback_context_local;
  ON_MESSAGE_RECEIVED on_message_received_local;
  MESSAGE_RECEIVER_HANDLE message_receiver_local;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                ,"messagereceiver_open",0x165,1,"NULL message_receiver");
    }
    l._4_4_ = 0x166;
  }
  else if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_IDLE) {
    set_message_receiver_state(message_receiver,MESSAGE_RECEIVER_STATE_OPENING);
    iVar1 = link_attach(message_receiver->link,on_transfer_received,on_link_state_changed,
                        (ON_LINK_FLOW_ON)0x0,message_receiver);
    if (iVar1 == 0) {
      message_receiver->on_message_received = on_message_received;
      message_receiver->callback_context = callback_context;
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                  ,"messagereceiver_open",0x16f,1,"Link attach failed");
      }
      l._4_4_ = 0x170;
      set_message_receiver_state(message_receiver,MESSAGE_RECEIVER_STATE_ERROR);
    }
  }
  else {
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int messagereceiver_open(MESSAGE_RECEIVER_HANDLE message_receiver, ON_MESSAGE_RECEIVED on_message_received, void* callback_context)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_IDLE)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_OPENING);
            if (link_attach(message_receiver->link, on_transfer_received, on_link_state_changed, NULL, message_receiver) != 0)
            {
                LogError("Link attach failed");
                result = MU_FAILURE;
                set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
            }
            else
            {
                message_receiver->on_message_received = on_message_received;
                message_receiver->callback_context = callback_context;

                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}